

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

string * __thiscall
MetaCommand::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,MetaCommand *this,TypeEnumType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(type) {
  case INT:
    pcVar2 = "int";
    pcVar1 = "";
    break;
  case FLOAT:
    pcVar2 = "float";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "not defined";
    pcVar1 = "";
    break;
  case STRING:
    pcVar2 = "string";
    pcVar1 = "";
    break;
  case LIST:
    pcVar2 = "list";
    pcVar1 = "";
    break;
  case FLAG:
    pcVar2 = "flag";
    pcVar1 = "";
    break;
  case BOOL:
    pcVar2 = "boolean";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

METAIO_STL::string MetaCommand::TypeToString(TypeEnumType type)
{
  switch(type)
    {
    case INT:
      return "int";
    case FLOAT:
      return "float";
    case STRING:
      return "string";
    case LIST:
      return "list";
    case FLAG:
      return "flag";
    case BOOL:
      return "boolean";
    default:
      return "not defined";
    }
}